

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall teetime::Configuration::Configuration(Configuration *this)

{
  Configuration *this_local;
  
  this->_vptr_Configuration = (_func_int **)&PTR__Configuration_001aeb00;
  std::
  vector<teetime::Configuration::connection,_std::allocator<teetime::Configuration::connection>_>::
  vector(&this->m_connections);
  std::
  set<std::shared_ptr<teetime::AbstractStage>,_std::less<std::shared_ptr<teetime::AbstractStage>_>,_std::allocator<std::shared_ptr<teetime::AbstractStage>_>_>
  ::set(&this->m_stages);
  std::
  map<teetime::AbstractStage_*,_teetime::Configuration::stageSettings,_std::less<teetime::AbstractStage_*>,_std::allocator<std::pair<teetime::AbstractStage_*const,_teetime::Configuration::stageSettings>_>_>
  ::map(&this->m_stageSettings);
  return;
}

Assistant:

Configuration::Configuration()
{
}